

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::DDLNodeTest_attach_detach_parent_Test_Test::~DDLNodeTest_attach_detach_parent_Test_Test
          (DDLNodeTest_attach_detach_parent_Test_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, attach_detach_parent_Test) {
    DDLNode *myParent = DDLNode::create("parent", "");
    DDLNode *myChild = DDLNode::create("child", "");
    EXPECT_EQ(nullptr, myParent->getParent());
    myChild->attachParent(myParent);
    EXPECT_EQ(myParent, myChild->getParent());

    myChild->detachParent();
    EXPECT_EQ(nullptr, myChild->getParent());

    // must not fail
    myChild->detachParent();
    myParent->detachParent();
    myParent->attachParent(nullptr);
}